

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ostream *poVar1;
  char *chr;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX;
  ostringstream os;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  to_string_abi_cxx11_(&local_1e8,(lest *)(this + 0x14),chr);
  poVar1 = std::operator<<((ostream *)local_188,(string *)&local_1e8);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_1e8);
  make_tuple_string<std::tuple<char,int,double,char_const*>,0ul>::make_abi_cxx11_
            (&local_1a8,(make_tuple_string<std::tuple<char,int,double,char_const*>,0ul> *)this,
             extraout_RDX);
  std::__cxx11::ostringstream::str();
  std::operator+(&local_1e8,&local_1a8,&local_1c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1e8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1e8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_1e8._M_string_length;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }